

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O2

bool basisu::unpack_bc7_mode1_3_7(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  byte bVar1;
  int iVar2;
  color_rgba *pcVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  uint8_t *puVar7;
  byte *pbVar8;
  uint32_t e;
  long lVar9;
  uint32_t i;
  ulong uVar10;
  uint32_t c;
  uint uVar11;
  uint32_t uVar12;
  ulong uVar13;
  uint32_t p;
  uint32_t uVar14;
  long lVar15;
  uint32_t bit_offset;
  ulong local_110;
  color_rgba (*local_108) [8];
  uint32_t local_100;
  uint32_t local_fc;
  ulong local_f8;
  ulong local_f0;
  color_rgba endpoints [4];
  uint32_t pbits [4];
  color_rgba block_colors [2] [8];
  uint32_t weights [16];
  
  local_108 = (color_rgba (*) [8])CONCAT71(local_108._1_7_,mode != 1);
  uVar11 = (uint)(mode == 1);
  local_110 = CONCAT71(local_110._1_7_,mode == 7);
  uVar12 = 5;
  if (mode != 7) {
    uVar12 = uVar11 ^ 7;
  }
  bit_offset = 0;
  local_fc = read_bits32((uint8_t *)pBlock_bits,&bit_offset,mode + 1);
  local_100 = 1 << ((byte)mode & 0x1f);
  if (local_fc == local_100) {
    uVar14 = (byte)local_110 + 3;
    local_110 = (ulong)(uVar11 | 2);
    local_108 = (color_rgba (*) [8])(((ulong)local_108 & 0xff) * 2 + 2);
    local_f0 = (ulong)mode;
    uVar5 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,6);
    local_f8 = CONCAT44(extraout_var,uVar5);
    for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 4) {
        uVar6 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,uVar12);
        puVar7 = color_rgba::operator[]((color_rgba *)((long)&endpoints[0].field_0 + lVar15),uVar5);
        *puVar7 = (uint8_t)uVar6;
      }
    }
    for (lVar15 = 0; local_108 != (color_rgba (*) [8])lVar15; lVar15 = lVar15 + 1) {
      uVar5 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,1);
      pbits[lVar15] = uVar5;
    }
    uVar13 = local_f8 & 0xffffffff;
    iVar2 = (int)local_110;
    uVar10 = 0;
    do {
      if (uVar10 == 0) {
LAB_00238a29:
        uVar5 = iVar2 - 1;
      }
      else {
        if (uVar10 == 0x10) goto LAB_00238a44;
        uVar5 = (uint32_t)local_110;
        if (uVar10 == (byte)basist::g_bc7_table_anchor_index_second_subset[uVar13])
        goto LAB_00238a29;
      }
      uVar5 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,uVar5);
      weights[uVar10] = uVar5;
      uVar10 = uVar10 + 1;
    } while( true );
  }
LAB_00238bc4:
  return local_fc == local_100;
LAB_00238a44:
  if (bit_offset != 0x80) {
    __assert_fail("bit_offset == 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                  ,0x216,"bool basisu::unpack_bc7_mode1_3_7(uint32_t, const void *, color_rgba *)");
  }
  local_108 = (color_rgba (*) [8])CONCAT71(local_108._1_7_,(int)local_f0 == 1);
  for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
    bVar1 = (byte)local_108 & 0x1f;
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      uVar4 = 0xff;
      if (uVar14 != uVar5) {
        pbVar8 = color_rgba::operator[](endpoints + lVar15,uVar5);
        uVar6 = bc7_dequant((uint)*pbVar8,pbits[(uint)lVar15 >> bVar1],uVar12);
        uVar4 = (uint8_t)uVar6;
      }
      puVar7 = color_rgba::operator[](endpoints + lVar15,uVar5);
      *puVar7 = uVar4;
    }
  }
  uVar10 = local_110;
  for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
    local_108 = block_colors + lVar15;
    for (lVar9 = 0; (uint32_t)lVar9 >> ((byte)uVar10 & 0x1f) == 0; lVar9 = lVar9 + 1) {
      pcVar3 = *local_108;
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        pbVar8 = color_rgba::operator[](endpoints + lVar15 * 2,uVar12);
        bVar1 = *pbVar8;
        pbVar8 = color_rgba::operator[](endpoints + lVar15 * 2 + 1,uVar12);
        uVar5 = bc7_interp((uint)bVar1,(uint)*pbVar8,(uint32_t)lVar9,(uint32_t)local_110);
        puVar7 = color_rgba::operator[](pcVar3 + lVar9,uVar12);
        *puVar7 = (uint8_t)uVar5;
      }
      uVar4 = 0xff;
      if ((int)local_f0 == 7) {
        uVar4 = (*local_108)[lVar9].field_0.m_comps[3];
      }
      (*local_108)[lVar9].field_0.m_comps[3] = uVar4;
      uVar10 = local_110;
    }
  }
  for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
    pPixels[lVar15].field_0 =
         block_colors[(byte)basist::g_bc7_partition2[lVar15 + (ulong)(uint)((int)local_f8 << 4)]]
         [weights[lVar15]].field_0;
  }
  goto LAB_00238bc4;
}

Assistant:

bool unpack_bc7_mode1_3_7(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
	{
		//const uint32_t SUBSETS = 2;
		const uint32_t ENDPOINTS = 4;
		const uint32_t COMPS = (mode == 7) ? 4 : 3;
		const uint32_t WEIGHT_BITS = (mode == 1) ? 3 : 2;
		const uint32_t ENDPOINT_BITS = (mode == 7) ? 5 : ((mode == 1) ? 6 : 7);
		const uint32_t PBITS = (mode == 1) ? 2 : 4;
		const uint32_t SHARED_PBITS = (mode == 1) ? true : false;
		const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
		uint32_t bit_offset = 0;
		const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

		if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

		const uint32_t part = read_bits32(pBuf, bit_offset, 6);

		color_rgba endpoints[ENDPOINTS];
		for (uint32_t c = 0; c < COMPS; c++)
			for (uint32_t e = 0; e < ENDPOINTS; e++)
				endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);
		
		uint32_t pbits[4];
		for (uint32_t p = 0; p < PBITS; p++)
			pbits[p] = read_bits32(pBuf, bit_offset, 1);
						
		uint32_t weights[16];
		for (uint32_t i = 0; i < 16; i++)
			weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == basist::g_bc7_table_anchor_index_second_subset[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);
		
		assert(bit_offset == 128);

		for (uint32_t e = 0; e < ENDPOINTS; e++)
			for (uint32_t c = 0; c < 4; c++)
				endpoints[e][c] = (uint8_t)((c == ((mode == 7U) ? 4U : 3U)) ? 255 : bc7_dequant(endpoints[e][c], pbits[SHARED_PBITS ? (e >> 1) : e], ENDPOINT_BITS));
		
		color_rgba block_colors[2][8];
		for (uint32_t s = 0; s < 2; s++)
			for (uint32_t i = 0; i < WEIGHT_VALS; i++)
			{
				for (uint32_t c = 0; c < COMPS; c++)
					block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
				block_colors[s][i][3] = (COMPS == 3) ? 255 : block_colors[s][i][3];
			}

		for (uint32_t i = 0; i < 16; i++)
			pPixels[i] = block_colors[basist::g_bc7_partition2[part * 16 + i]][weights[i]];

		return true;
	}